

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondRvol.cpp
# Opt level: O0

void __thiscall OpenMD::HBondRvol::writeDensityR(HBondRvol *this)

{
  SimInfo *pSVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  string *psVar6;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  undefined8 uVar11;
  StaticAnalyser *in_RDI;
  double dVar12;
  double dVar13;
  RealType Rval;
  uint i;
  ofstream qRstream;
  int nFrames;
  DumpReader reader;
  double pi;
  errorStruct *in_stack_ffffffffffffeaa0;
  uint local_1484;
  ostream local_1480 [368];
  string *in_stack_ffffffffffffecf0;
  SimInfo *in_stack_ffffffffffffecf8;
  DumpReader *in_stack_ffffffffffffed00;
  
  dVar12 = acos(-1.0);
  DumpReader::DumpReader
            (in_stack_ffffffffffffed00,in_stack_ffffffffffffecf8,in_stack_ffffffffffffecf0);
  iVar3 = DumpReader::getNFrames((DumpReader *)in_stack_ffffffffffffeaa0);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_1480,pcVar4,_S_out);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    uVar11 = std::__cxx11::string::c_str();
    in_stack_ffffffffffffeaa0 = &painCave;
    snprintf(painCave.errMsg,2000,"HBondRvol: unable to open %s\n",uVar11);
    ((DumpReader *)in_stack_ffffffffffffeaa0)->buffer[0x57a] = '\x01';
    ((DumpReader *)in_stack_ffffffffffffeaa0)->buffer[0x57b] = '\0';
    ((DumpReader *)in_stack_ffffffffffffeaa0)->buffer[0x57c] = '\0';
    ((DumpReader *)in_stack_ffffffffffffeaa0)->buffer[0x57d] = '\0';
    simError();
  }
  else {
    poVar5 = std::operator<<(local_1480,"# ");
    psVar6 = StaticAnalyser::getAnalysisType_abi_cxx11_(in_RDI);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(local_1480,"#selection 1: (");
    poVar5 = std::operator<<(poVar5,(string *)&in_RDI[1].info_);
    std::operator<<(poVar5,")\n");
    poVar5 = std::operator<<(local_1480,"#selection 2: (");
    poVar5 = std::operator<<(poVar5,(string *)(in_RDI + 9));
    std::operator<<(poVar5,")\n");
    poVar5 = std::operator<<(local_1480,"#selection 3: (");
    poVar5 = std::operator<<(poVar5,(string *)
                                    &in_RDI[0x10].outputTypes_.
                                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar5,")\n");
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      poVar5 = std::operator<<(local_1480,"# parameters: ");
      poVar5 = std::operator<<(poVar5,(string *)&in_RDI->paramString_);
      std::operator<<(poVar5,"\n");
    }
    poVar5 = std::operator<<(local_1480,"#distance");
    std::operator<<(poVar5,"\tH Bonds\n");
    for (local_1484 = 0;
        sVar8 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)
                           &in_RDI[0x19].dumpFilename_.field_2), local_1484 < sVar8;
        local_1484 = local_1484 + 1) {
      dVar13 = ((double)local_1484 + 0.5) * (double)in_RDI[0x19].info_;
      pSVar1 = in_RDI[0x19].info_;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          ((long)&in_RDI[0x19].outputFilename_.field_2 + 8),(ulong)local_1484);
      *pvVar9 = (int)(dVar12 * 4.0 * dVar13 * dVar13 * (double)pSVar1);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&in_RDI[0x19].outputFilename_,
                          (ulong)local_1484);
      if ((*pvVar9 == 0) ||
         (pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              ((long)&in_RDI[0x19].outputFilename_.field_2 + 8),(ulong)local_1484),
         *pvVar9 == 0)) {
        poVar5 = (ostream *)std::ostream::operator<<(local_1480,dVar13);
        poVar5 = std::operator<<(poVar5,"\t");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
        std::operator<<(poVar5,"\n");
      }
      else {
        poVar5 = (ostream *)std::ostream::operator<<(local_1480,dVar13);
        poVar5 = std::operator<<(poVar5,"\t");
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &in_RDI[0x19].dumpFilename_.field_2,(ulong)local_1484);
        dVar13 = *pvVar10;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            ((long)&in_RDI[0x19].outputFilename_.field_2 + 8),(ulong)local_1484);
        poVar5 = (ostream *)
                 std::ostream::operator<<(poVar5,(dVar13 / (double)*pvVar9) / (double)iVar3);
        std::operator<<(poVar5,"\n");
      }
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_1480);
  DumpReader::~DumpReader((DumpReader *)in_stack_ffffffffffffeaa0);
  return;
}

Assistant:

void HBondRvol::writeDensityR() {
    // compute average box length:

    double pi = acos(-1.0);
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    std::ofstream qRstream(outputFilename_.c_str());
    if (qRstream.is_open()) {
      qRstream << "# " << getAnalysisType() << "\n";
      qRstream << "#selection 1: (" << selectionScript1_ << ")\n";
      qRstream << "#selection 2: (" << selectionScript2_ << ")\n";
      qRstream << "#selection 3: (" << selectionScript3_ << ")\n";
      if (!paramString_.empty())
        qRstream << "# parameters: " << paramString_ << "\n";

      qRstream << "#distance"
               << "\tH Bonds\n";
      for (unsigned int i = 0; i < sliceQ_.size(); ++i) {
        RealType Rval = (i + 0.5) * deltaR_;
        binvol_[i]    = (4 * pi * (Rval * Rval) * deltaR_);
        if (sliceCount_[i] != 0 && binvol_[i] != 0) {
          qRstream << Rval << "\t" << sliceQ_[i] / (binvol_[i]) / nFrames
                   << "\n";
        } else {
          qRstream << Rval << "\t" << 0 << "\n";
        }
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "HBondRvol: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    qRstream.close();
  }